

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prolog.cpp
# Opt level: O2

bool __thiscall Variable::unify(Variable *this,Term *t)

{
  Variable *pVVar1;
  int iVar2;
  
  pVVar1 = (Variable *)this->instance;
  if (pVVar1 != this) {
    iVar2 = (*(pVVar1->super_Term)._vptr_Term[1])(pVVar1,t);
    return SUB41(iVar2,0);
  }
  Trace::Push(this);
  this->instance = t;
  return true;
}

Assistant:

bool Variable::unify(Term *t)
{
    if (instance == this) {
        // The variable is uninstantiated.
        // Bind it to this term.
        Trace::Push(this);
        instance = t;
        return true;
    }

    // This variable is already instantiated.
    // Redirect the request to the instance.
    return instance->unify(t);
}